

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O1

bool tinyusdz::ToPrimSpec(MtlxModel *model,PrimSpec *ps,string *err)

{
  int iVar1;
  ostream *poVar2;
  mapped_type *this;
  _Base_ptr p_Var3;
  char *pcVar4;
  _Rb_tree_header *p_Var5;
  PrimSpec shaders;
  PrimSpec root;
  PrimSpec materials;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_10f8;
  undefined1 local_10e0 [40];
  string local_10b8 [8];
  char *local_10b0;
  undefined1 local_b78 [40];
  undefined1 local_b50 [8];
  char *local_b48;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> local_b30 [54];
  undefined1 local_610 [48];
  char *local_5e0;
  any local_5c8;
  bool local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  pointer local_598;
  bool local_590;
  pointer local_588;
  pointer local_580;
  pointer local_578;
  AttrMetas AStack_570;
  undefined8 local_368;
  Type local_360;
  Path PStack_358;
  pointer local_288;
  undefined1 local_280 [544];
  bool local_60;
  string asStack_58 [32];
  bool local_38;
  
  iVar1 = ::std::__cxx11::string::compare((char *)&model->shader_name);
  if (iVar1 == 0) {
    pcVar4 = "UsdPreviewSurface";
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)&model->shader_name);
    if (iVar1 != 0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                 ,0x51);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"ToPrimSpec",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
      poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x3bc);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,"Unsupported shader_name: ",0x19);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_610,(model->shader_name)._M_dataplus._M_p,
                          (model->shader_name)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,local_10e0._0_8_);
        if ((undefined1 *)local_10e0._0_8_ != local_10e0 + 0x10) {
          operator_delete((void *)local_10e0._0_8_,CONCAT71(local_10e0._17_7_,local_10e0[0x10]) + 1)
          ;
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
      ::std::ios_base::~ios_base((ios_base *)&local_5a0);
      return false;
    }
    pcVar4 = "AutodeskStandardSurface";
  }
  local_10e0._0_8_ = local_10e0 + 0x10;
  local_10e0[0x10] = '\0';
  local_10e0._8_8_ = (pointer)0x0;
  ::std::__cxx11::string::_M_replace((ulong)local_10e0,0,(char *)0x0,(ulong)pcVar4);
  detail::MakeProperty<tinyusdz::Token>((Property *)local_610,(Token *)local_10e0);
  local_b78._0_8_ = local_b78 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b78,"info:id","");
  this = ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
         ::operator[](&ps->_props,(key_type *)local_b78);
  ::std::__cxx11::string::operator=((string *)this,(string *)local_610);
  (this->_attrib)._variability = local_610._32_4_;
  (this->_attrib)._varying_authored = (bool)local_610[0x24];
  ::std::__cxx11::string::operator=
            ((string *)&(this->_attrib)._type_name,(string *)(local_610 + 0x28));
  linb::any::operator=((any *)&(this->_attrib)._var,&local_5c8);
  (this->_attrib)._var._blocked = local_5b0;
  local_10f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_10f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish =
       *(pointer *)
        ((long)&(this->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data + 8);
  local_10f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       *(pointer *)
        ((long)&(this->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data + 0x10);
  (this->_attrib)._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = local_5a8;
  *(pointer *)
   ((long)&(this->_attrib)._var._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data + 8) = local_5a0;
  *(pointer *)
   ((long)&(this->_attrib)._var._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data + 0x10) = local_598;
  local_5a8 = (pointer)0x0;
  local_5a0 = (pointer)0x0;
  local_598 = (pointer)0x0;
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)&local_10f8);
  (this->_attrib)._var._ts._dirty = local_590;
  local_10f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_10f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_10f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_start = local_588;
  (this->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_finish = local_580;
  (this->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = local_578;
  local_588 = (pointer)0x0;
  local_580 = (pointer)0x0;
  local_578 = (pointer)0x0;
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_10f8);
  AttrMetas::operator=(&(this->_attrib)._metas,&AStack_570);
  *(undefined8 *)&this->_listOpQual = local_368;
  (this->_rel).type = local_360;
  Path::operator=(&(this->_rel).targetPath,&PStack_358);
  local_10f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->_rel).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_10f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->_rel).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_10f8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->_rel).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->_rel).targetPathVector.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start = local_288;
  (this->_rel).targetPathVector.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_280._0_8_;
  (this->_rel).targetPathVector.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_280._8_8_;
  local_288 = (pointer)0x0;
  local_280._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_280._8_8_ = (pointer)0x0;
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_10f8);
  (this->_rel).listOpQual = local_280._16_4_;
  AttrMetas::operator=(&(this->_rel)._metas,(AttrMetas *)(local_280 + 0x18));
  (this->_rel)._varying_authored = local_60;
  ::std::__cxx11::string::operator=((string *)&this->_prop_value_type_name,asStack_58);
  this->_has_custom = local_38;
  if ((undefined1 *)local_b78._0_8_ != local_b78 + 0x10) {
    operator_delete((void *)local_b78._0_8_,local_b78._16_8_ + 1);
  }
  Property::~Property((Property *)local_610);
  if ((undefined1 *)local_10e0._0_8_ != local_10e0 + 0x10) {
    operator_delete((void *)local_10e0._0_8_,CONCAT71(local_10e0._17_7_,local_10e0[0x10]) + 1);
  }
  PrimSpec::PrimSpec((PrimSpec *)local_610);
  ::std::__cxx11::string::_M_replace((ulong)(local_610 + 0x28),0,local_5e0,0x436871);
  local_610._0_4_ = Def;
  p_Var3 = (model->surface_materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(model->surface_materials)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      PrimSpec::PrimSpec((PrimSpec *)local_10e0);
      local_10e0._0_8_ = local_10e0._0_8_ & 0xffffffff00000000;
      ::std::__cxx11::string::_M_replace
                ((ulong)(local_10e0 + 8),0,(char *)CONCAT71(local_10e0._17_7_,local_10e0[0x10]),
                 0x4225e7);
      ::std::__cxx11::string::_M_assign(local_10b8);
      PrimSpec::~PrimSpec((PrimSpec *)local_10e0);
      p_Var3 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  PrimSpec::PrimSpec((PrimSpec *)local_10e0);
  ::std::__cxx11::string::_M_replace((ulong)local_10b8,0,local_10b0,0x43687b);
  local_10e0._0_8_ = local_10e0._0_8_ & 0xffffffff00000000;
  PrimSpec::PrimSpec((PrimSpec *)local_b78);
  ::std::__cxx11::string::_M_replace((ulong)local_b50,0,local_b48,0x427add);
  local_b78._0_8_ = local_b78._0_8_ & 0xffffffff00000000;
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
            (local_b30,(value_type *)local_610);
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
            (local_b30,(PrimSpec *)local_10e0);
  if ((PrimSpec *)local_b78 != ps) {
    PrimSpec::MoveFrom(ps,(PrimSpec *)local_b78);
  }
  PrimSpec::~PrimSpec((PrimSpec *)local_b78);
  PrimSpec::~PrimSpec((PrimSpec *)local_10e0);
  PrimSpec::~PrimSpec((PrimSpec *)local_610);
  return true;
}

Assistant:

bool ToPrimSpec(const MtlxModel &model, PrimSpec &ps, std::string *err) {
  //
  // def "MaterialX" {
  //
  //   def "Materials" {
  //     def Material ... {
  //     }
  //   }
  //   def "Shaders" {
  //   }
  constexpr auto kAutodeskStandardSurface = "AutodeskStandardSurface";

  if (model.shader_name == kUsdPreviewSurface) {
    ps.props()["info:id"] =
        detail::MakeProperty(value::token(kUsdPreviewSurface));
  } else if (model.shader_name == kAutodeskStandardSurface) {
    ps.props()["info:id"] =
        detail::MakeProperty(value::token(kAutodeskStandardSurface));
  } else {
    PUSH_ERROR_AND_RETURN("Unsupported shader_name: " << model.shader_name);
  }

  PrimSpec materials;
  materials.name() = "Materials";
  materials.specifier() = Specifier::Def;

  for (const auto &item : model.surface_materials) {
    PrimSpec material;
    material.specifier() = Specifier::Def;
    material.typeName() = "Material";

    material.name() = item.second.name;
  }

  PrimSpec shaders;
  shaders.name() = "Shaders";
  shaders.specifier() = Specifier::Def;

  PrimSpec root;
  root.name() = "MaterialX";
  root.specifier() = Specifier::Def;

  root.children().push_back(materials);
  root.children().push_back(shaders);

  ps = std::move(root);

  return true;
}